

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O2

void __thiscall
cfd::core::AbstractTransaction::AddScriptWitnessStack
          (AbstractTransaction *this,uint32_t tx_in_index,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  wally_tx *tx;
  wally_tx_witness_stack *pwVar1;
  uchar *witness;
  ulong index;
  int iVar2;
  wally_tx_witness_stack *pwVar3;
  CfdException *this_00;
  uchar *witness_len;
  undefined4 in_register_00000034;
  int ret;
  allocator local_79;
  wally_tx_witness_stack *stack_pointer;
  undefined1 local_70 [32];
  string function_name;
  
  index = (ulong)tx_in_index;
  (*this->_vptr_AbstractTransaction[0xb])
            (this,CONCAT44(in_register_00000034,tx_in_index),0x1b2,"AddScriptWitnessStack");
  tx = (wally_tx *)this->wally_tx_pointer_;
  if (tx->num_inputs <= index) {
    return;
  }
  ret = 0;
  stack_pointer = (wally_tx_witness_stack *)0x0;
  ::std::__cxx11::string::string
            ((string *)&function_name,"wally_tx_witness_stack_init_alloc",(allocator *)local_70);
  pwVar1 = tx->inputs[index].witness;
  pwVar3 = pwVar1;
  if ((pwVar1 != (wally_tx_witness_stack *)0x0) ||
     (ret = wally_tx_witness_stack_init_alloc(1,&stack_pointer), pwVar3 = stack_pointer, ret == 0))
  {
    stack_pointer = pwVar3;
    ::std::__cxx11::string::assign((char *)&function_name);
    witness = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start;
    witness_len = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_finish + -(long)witness;
    if (witness_len == (uchar *)0x0) {
      witness_len = (uchar *)0x0;
      witness = (uchar *)0x0;
    }
    ret = wally_tx_witness_stack_add(stack_pointer,witness,(size_t)witness_len);
    if ((pwVar1 == (wally_tx_witness_stack *)0x0) && (ret == 0)) {
      ::std::__cxx11::string::assign((char *)&function_name);
      ret = wally_tx_set_input_witness(tx,index,stack_pointer);
    }
    iVar2 = ret;
    if (stack_pointer != (wally_tx_witness_stack *)0x0 && pwVar1 == (wally_tx_witness_stack *)0x0) {
      wally_tx_witness_stack_free(stack_pointer);
    }
    if (iVar2 == 0) {
      ::std::__cxx11::string::~string((string *)&function_name);
      return;
    }
  }
  local_70._0_8_ = "cfdcore_transaction_common.cpp";
  local_70._8_4_ = 0x1e0;
  local_70._16_8_ = "AddScriptWitnessStack";
  logger::warn<std::__cxx11::string&,int&>
            ((CfdSourceLocation *)local_70,"{} NG[{}].",&function_name,&ret);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_70,"witness stack error.",&local_79);
  CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_70);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void AbstractTransaction::AddScriptWitnessStack(
    uint32_t tx_in_index, const std::vector<uint8_t> &data) {
  CheckTxInIndex(tx_in_index, __LINE__, __FUNCTION__);

  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  if (tx_pointer->num_inputs > tx_in_index) {
    int ret = WALLY_OK;
    bool is_alloc = false;
    struct wally_tx_witness_stack *stack_pointer = NULL;

    std::string function_name = "wally_tx_witness_stack_init_alloc";
    if (tx_pointer->inputs[tx_in_index].witness == NULL) {
      is_alloc = true;
      ret = wally_tx_witness_stack_init_alloc(1, &stack_pointer);
    } else {
      stack_pointer = tx_pointer->inputs[tx_in_index].witness;
    }

    if (ret == WALLY_OK) {
      try {
        // append witness stack
        function_name = "wally_tx_witness_stack_add";
        if (data.empty()) {
          ret = wally_tx_witness_stack_add(stack_pointer, NULL, 0);
        } else {
          ret = wally_tx_witness_stack_add(
              stack_pointer, data.data(), data.size());
        }

        // append tx input
        if (is_alloc && (ret == WALLY_OK)) {
          function_name = "wally_tx_set_input_witness";
          ret = wally_tx_set_input_witness(
              tx_pointer, tx_in_index, stack_pointer);
        }
      } catch (...) {
        // internal error.
        warn(CFD_LOG_SOURCE, "system error.");
        ret = WALLY_ERROR;
      }

      if (is_alloc && stack_pointer) {
        wally_tx_witness_stack_free(stack_pointer);
      }
    }

    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "{} NG[{}].", function_name, ret);
      throw CfdException(kCfdIllegalStateError, "witness stack error.");
    }
  }
}